

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::EnumDescriptorProto::_InternalParse
          (EnumDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  Arena *p;
  EnumDescriptorProto *this_00;
  EnumDescriptorProto *in_RDX;
  char *in_RSI;
  ParseContext *in_RDI;
  uint32 tag;
  Arena *arena;
  HasBits has_bits;
  EnumDescriptorProto *in_stack_ffffffffffffff98;
  EnumDescriptorProto *in_stack_ffffffffffffffa0;
  EnumDescriptorProto *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  HasBits<1UL> local_2c;
  EnumDescriptorProto *local_28;
  char *local_20;
  HasBits<1UL> *local_10;
  HasBits<1UL> *local_8;
  
  local_10 = &local_2c;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_8 = local_10;
  memset(local_10,0,4);
  p = GetArenaNoVirtual(in_stack_ffffffffffffffa0);
LAB_00685a41:
  do {
    bVar1 = internal::ParseContext::Done
                      ((ParseContext *)in_stack_ffffffffffffffa0,(char **)in_stack_ffffffffffffff98)
    ;
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00685dca;
    local_20 = internal::ReadTag((char *)p,
                                 (uint32 *)
                                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                 (uint32)((ulong)in_RDI >> 0x20));
    if (local_20 == (char *)0x0) goto LAB_00685de7;
    this_00 = (EnumDescriptorProto *)(ulong)((in_stack_ffffffffffffffc4 >> 3) - 1);
    switch(this_00) {
    case (EnumDescriptorProto *)0x0:
      if ((in_stack_ffffffffffffffc4 & 0xff) != 10) break;
      _internal_mutable_name_abi_cxx11_(this_00);
      local_20 = internal::InlineGreedyStringParserUTF8Verify
                           ((string *)this_00,(char *)in_stack_ffffffffffffffa8,
                            (ParseContext *)in_stack_ffffffffffffffa0,
                            (char *)in_stack_ffffffffffffff98);
      goto joined_r0x00685b01;
    case (EnumDescriptorProto *)0x1:
      if ((in_stack_ffffffffffffffc4 & 0xff) == 0x12) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          in_stack_ffffffffffffffa8 = local_28;
          _internal_add_value((EnumDescriptorProto *)0x685b60);
          local_20 = internal::ParseContext::
                     ParseMessage<google::protobuf::EnumValueDescriptorProto>
                               (in_RDI,(EnumValueDescriptorProto *)this_00,
                                (char *)in_stack_ffffffffffffffa8);
          if (local_20 == (char *)0x0) goto LAB_00685de7;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            ((EpsCopyInputStream *)local_28,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<18u>(local_20), bVar1));
        goto LAB_00685a41;
      }
      break;
    case (EnumDescriptorProto *)0x2:
      if ((in_stack_ffffffffffffffc4 & 0xff) == 0x1a) {
        in_stack_ffffffffffffffa0 = local_28;
        _internal_mutable_options(local_28);
        local_20 = internal::ParseContext::ParseMessage<google::protobuf::EnumOptions>
                             (in_RDI,(EnumOptions *)this_00,(char *)in_stack_ffffffffffffffa8);
        goto joined_r0x00685b01;
      }
      break;
    case (EnumDescriptorProto *)0x3:
      if ((in_stack_ffffffffffffffc4 & 0xff) == 0x22) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          in_stack_ffffffffffffff98 = local_28;
          _internal_add_reserved_range((EnumDescriptorProto *)0x685c6b);
          local_20 = internal::ParseContext::
                     ParseMessage<google::protobuf::EnumDescriptorProto_EnumReservedRange>
                               (in_RDI,(EnumDescriptorProto_EnumReservedRange *)this_00,
                                (char *)in_stack_ffffffffffffffa8);
          if (local_20 == (char *)0x0) goto LAB_00685de7;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            ((EpsCopyInputStream *)local_28,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<34u>(local_20), bVar1));
        goto LAB_00685a41;
      }
      break;
    case (EnumDescriptorProto *)0x4:
      if ((in_stack_ffffffffffffffc4 & 0xff) == 0x2a) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          _internal_add_reserved_name_abi_cxx11_((EnumDescriptorProto *)0x685d08);
          local_20 = internal::InlineGreedyStringParserUTF8Verify
                               ((string *)this_00,(char *)in_stack_ffffffffffffffa8,
                                (ParseContext *)in_stack_ffffffffffffffa0,
                                (char *)in_stack_ffffffffffffff98);
          if (local_20 == (char *)0x0) goto LAB_00685de7;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            ((EpsCopyInputStream *)local_28,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<42u>(local_20), bVar1));
        goto LAB_00685a41;
      }
    }
    if (((in_stack_ffffffffffffffc4 & 7) == 4) || (in_stack_ffffffffffffffc4 == 0)) {
      internal::EpsCopyInputStream::SetLastTag
                ((EpsCopyInputStream *)local_28,in_stack_ffffffffffffffc4);
      goto LAB_00685dca;
    }
    local_20 = internal::UnknownFieldParse
                         (in_stack_ffffffffffffffc4,(InternalMetadataWithArena *)in_RDI,
                          (char *)this_00,(ParseContext *)in_stack_ffffffffffffffa8);
joined_r0x00685b01:
    if (local_20 == (char *)0x0) {
LAB_00685de7:
      local_20 = (char *)0x0;
LAB_00685dca:
      internal::HasBits<1UL>::Or
                ((HasBits<1UL> *)&(in_RDI->super_EpsCopyInputStream).next_chunk_,&local_2c);
      return local_20;
    }
  } while( true );
}

Assistant:

const char* EnumDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.EnumDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_value(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.EnumOptions options = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.EnumDescriptorProto.EnumReservedRange reserved_range = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_reserved_range(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string reserved_name = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_reserved_name(), ptr, ctx, "google.protobuf.EnumDescriptorProto.reserved_name");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<42>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}